

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpConnection.cpp
# Opt level: O0

void __thiscall FIX::HttpConnection::processStream(HttpConnection *this)

{
  bool bVar1;
  InvalidMessage *anon_var_0;
  HttpMessage request;
  undefined1 local_30 [8];
  string msg;
  HttpConnection *this_local;
  
  msg.field_2._8_8_ = this;
  std::__cxx11::string::string((string *)local_30);
  bVar1 = readMessage(this,(string *)local_30);
  if (bVar1) {
    HttpMessage::HttpMessage((HttpMessage *)&anon_var_0,(string *)local_30);
    processRequest(this,(HttpMessage *)&anon_var_0);
    HttpMessage::~HttpMessage((HttpMessage *)&anon_var_0);
  }
  request.m_parameters._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = 1;
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

void HttpConnection::processStream() {
  std::string msg;
  try {
    if (!readMessage(msg)) {
      return;
    }
    HttpMessage request(msg);
    processRequest(request);
  } catch (InvalidMessage &) {
    disconnect(400);
    return;
  }

  return;
}